

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O3

float min_elem(float *arr,int length)

{
  float fVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = *arr;
  if (1 < length) {
    uVar2 = 1;
    do {
      fVar1 = arr[uVar2];
      fVar4 = fVar1;
      if (fVar1 <= 0.001) {
        fVar4 = fVar3;
      }
      fVar3 = (float)(~-(uint)(fVar1 < fVar3) & (uint)fVar3 | (uint)fVar4 & -(uint)(fVar1 < fVar3));
      uVar2 = uVar2 + 1;
    } while ((uint)length != uVar2);
    return fVar3;
  }
  return fVar3;
}

Assistant:

float min_elem(float* arr, int length)
{
  float min = arr[0];
  for (int i = 1; i < length; i++)
    if (arr[i] < min && arr[i] > 0.001)
      min = arr[i];
  return min;
}